

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O3

void __thiscall Imaginer::Utils::iRpn::cut(iRpn *this)

{
  RPNnode *pRVar1;
  ostream *poVar2;
  long lVar3;
  int end;
  long lVar4;
  long lVar5;
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> funList;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_68;
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> local_58;
  long local_48;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_40;
  
  local_68._size = 0x400;
  local_68._top = -1;
  local_68._data = (RPNnode *)operator_new__(0x4000);
  lVar3 = 0;
  do {
    (&(local_68._data)->_is)[lVar3] = false;
    *(undefined8 *)((long)&(local_68._data)->_node + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x4000);
  local_40._data._0_4_ = 0x400;
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::iStack
            (&local_58,(int *)&local_40);
  lVar3 = (long)this->_operands->_top;
  if (0 < lVar3) {
    lVar4 = 0;
    lVar5 = 0x18;
    end = 0;
    local_48 = lVar3;
    do {
      pRVar1 = this->_operands->_data;
      if ((*(char *)((long)&pRVar1[-1]._node + lVar5) == '\x01') &&
         (*(char *)((long)&pRVar1->_node + lVar5) == '\x01')) {
        iStack<Imaginer::Utils::iRpn::RPNnode>::cut(&local_40,(int)this->_operands,end);
        iStack<Imaginer::Utils::iRpn::RPNnode>::operator=(&local_68,&local_40);
        if ((void *)CONCAT44(local_40._data._4_4_,local_40._data._0_4_) != (void *)0x0) {
          operator_delete__((void *)CONCAT44(local_40._data._4_4_,local_40._data._0_4_));
        }
        poVar2 = operator<<((ostream *)&std::cout,&local_68);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        lVar3 = (long)local_58._top;
        local_58._top = (int)(lVar3 + 1);
        iStack<Imaginer::Utils::iRpn::RPNnode>::operator=(local_58._data + lVar3 + 1,&local_68);
        lVar3 = local_48;
        end = end + (int)lVar4;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar3 != lVar4);
  }
  poVar2 = operator<<((ostream *)&std::cout,&local_58);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  poVar2 = operator<<((ostream *)&std::cout,&local_68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::~iStack(&local_58);
  if (local_68._data != (RPNnode *)0x0) {
    operator_delete__(local_68._data);
  }
  return;
}

Assistant:

void iRpn::cut()
{
    iStack<RPNnode> result;
    iStack< iStack<RPNnode> > funList;
    int size = _operands->size();
    int i = 0;
    int flag = 0;
    for(;i < size;++i)
    {
        if((*_operands)[i] && (*_operands)[i+1])
        {
            result = _operands->cut(flag,flag+i);
            flag += i;
            std::cout << result << std::endl;
            funList.push(result);
            continue;
        }
    }
    //funList = _operands->cut(0,i);
    //result  = _operands->copy();
    std::cout << funList << std::endl;
    std::cout << result << std::endl;
}